

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

Int32 testing::internal::Int32FromEnvOrDie(char *var,Int32 default_val)

{
  bool bVar1;
  char *str;
  size_t sVar2;
  ostream *poVar3;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar4;
  Int32 result;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  Int32 local_24;
  
  str = getenv(var);
  if (str != (char *)0x0) {
    Message::Message((Message *)&local_30);
    poVar3 = (ostream *)(local_30.ptr_ + 0x10);
    if (local_30.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar3 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"The value of environment variable ",0x22);
    if (var == (char *)0x0) {
      sVar4.ptr_ = local_30.ptr_ + 0x10;
      sVar2 = 6;
      var = "(null)";
    }
    else {
      sVar4.ptr_ = local_30.ptr_;
      if (local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        sVar4.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_30.ptr_ + 0x10);
      }
      sVar2 = strlen(var);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)sVar4.ptr_,var,sVar2);
    bVar1 = ParseInt32((Message *)&local_30,str,&local_24);
    if (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30.ptr_ + 8))();
    }
    default_val = local_24;
    if (!bVar1) {
      exit(1);
    }
  }
  return default_val;
}

Assistant:

Int32 Int32FromEnvOrDie(const char* var, Int32 default_val) {
  const char* str_val = posix::GetEnv(var);
  if (str_val == NULL) {
    return default_val;
  }

  Int32 result;
  if (!ParseInt32(Message() << "The value of environment variable " << var,
                  str_val, &result)) {
    exit(EXIT_FAILURE);
  }
  return result;
}